

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.hpp
# Opt level: O0

void remora::kernels::
     assign<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
               (matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
                *m,matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                   *e)

{
  matrix<double,_remora::column_major,_remora::cpu_tag> *pmVar1;
  size_type sVar2;
  undefined8 in_RSI;
  matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDI;
  
  pmVar1 = matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(in_RDI);
  sVar2 = matrix<double,_remora::column_major,_remora::cpu_tag>::size1(pmVar1);
  if (sVar2 != 0) {
    pmVar1 = matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
             ::operator()(in_RDI);
    sVar2 = matrix<double,_remora::column_major,_remora::cpu_tag>::size2(pmVar1);
    if (sVar2 != 0) {
      detail::
      matrix_assign<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::row_major,remora::dense_tag,remora::dense_tag,remora::cpu_tag>
                (in_RDI,in_RSI);
    }
  }
  return;
}

Assistant:

void assign(
	matrix_expression<M, Device>& m,
	matrix_expression<E, Device> const& e
){
	REMORA_SIZE_CHECK(m().size1() == e().size1());
	REMORA_SIZE_CHECK(m().size2() == e().size2());
	if(m().size1() == 0|| m().size2() == 0) return;
	typedef typename M::orientation::orientation MOrientation;
	typedef typename E::orientation::orientation EOrientation;
	typedef typename M::evaluation_category::tag MCategory;
	typedef typename E::evaluation_category::tag ECategory;
	detail::matrix_assign(m, e, MOrientation(), EOrientation(), MCategory(), ECategory());
}